

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void IntegrateFrequencyTable
               (BSDF *bsdf,Vector3f *wo,int sampleCount,int thetaRes,int phiRes,Float *target)

{
  Float in_ECX;
  Float in_EDX;
  function<float_(float,_float)> *in_RSI;
  Float in_R8D;
  float *in_R9;
  float fVar1;
  int j;
  int i;
  Float factorPhi;
  Float factorTheta;
  Float in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  function<float_(float,_float)> *in_stack_ffffffffffffff90;
  int local_38;
  int local_34;
  float *pfVar2;
  Float in_stack_ffffffffffffffe0;
  
  memset(in_R9,0,(long)((int)in_ECX * (int)in_R8D) << 2);
  for (local_34 = 0; local_34 < (int)in_ECX; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (int)in_R8D; local_38 = local_38 + 1) {
      fVar1 = (float)(int)in_EDX;
      std::function<float(float,float)>::
      function<IntegrateFrequencyTable(pbrt::BSDF_const*,pbrt::Vector3<float>const&,int,int,int,float*)::__0,void>
                (in_stack_ffffffffffffff90,
                 (anon_class_16_2_e787c6fe *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      in_stack_ffffffffffffff88 =
           AdaptiveSimpson2D(in_RSI,in_EDX,in_ECX,in_R8D,in_stack_ffffffffffffffe0,
                             (Float)((ulong)in_R9 >> 0x20),(int)in_R9);
      pfVar2 = in_R9 + 1;
      *in_R9 = fVar1 * in_stack_ffffffffffffff88;
      std::function<float_(float,_float)>::~function((function<float_(float,_float)> *)0x4f524b);
      in_R9 = pfVar2;
    }
  }
  return;
}

Assistant:

void IntegrateFrequencyTable(const BSDF* bsdf, const Vector3f& wo, int sampleCount,
                             int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = Pi / thetaRes, factorPhi = (2 * Pi) / phiRes;

    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            *target++ =
                sampleCount *
                AdaptiveSimpson2D(
                    [&](Float theta, Float phi) -> Float {
                        Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
                        Float cosPhi = std::cos(phi), sinPhi = std::sin(phi);
                        Vector3f wiL(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta);
                        return bsdf->PDF(wo, bsdf->LocalToRender(wiL)) * sinTheta;
                    },
                    i* factorTheta, j* factorPhi, (i + 1) * factorTheta,
                    (j + 1) * factorPhi);
        }
    }
}